

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlstring.c
# Opt level: O0

err_t ReadData(ebml_master *Element,stream *Input,ebml_parser_context *ParserContext,
              bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ebml_parser_context *peVar4;
  bool_t bVar5;
  filepos_t fVar6;
  long lVar7;
  filepos_t fVar8;
  ebml_context *Context_00;
  undefined4 uVar9;
  long local_128;
  filepos_t local_d8;
  filepos_t Offset;
  filepos_t element_size;
  filepos_t OffSet;
  filepos_t DataPos;
  filepos_t MaxSizeToRead;
  ebml_parser_context Context;
  size_t CRCDataSize;
  uint8_t *CRCData;
  array CrcBuffer;
  stream *ReadStream;
  ebml_crc *CRCElement;
  ebml_element *SubElement;
  bool_t bFirst;
  size_t sStack_48;
  int UpperEltFound;
  size_t DepthCheckCRC_local;
  bool_t bStack_38;
  int Scope_local;
  bool_t AllowDummyElt_local;
  ebml_parser_context *ParserContext_local;
  stream *Input_local;
  ebml_master *Element_local;
  uint8_t **local_10;
  
  bFirst._4_4_ = 0;
  bVar3 = true;
  CRCElement = (ebml_crc *)0x0;
  ReadStream = (stream *)0x0;
  CRCDataSize = 0;
  Context.Profile = 0;
  Context._28_4_ = 0;
  CrcBuffer._Used = (size_t)Input;
  sStack_48 = DepthCheckCRC;
  DepthCheckCRC_local._4_4_ = Scope;
  bStack_38 = AllowDummyElt;
  AllowDummyElt_local = (bool_t)ParserContext;
  ParserContext_local = (ebml_parser_context *)Input;
  Input_local = (stream *)Element;
  NodeTree_Clear((nodetree *)Element);
  Input_local->URL[0x45] = '\0';
  if ((0 < *(long *)(Input_local->URL + 0x18)) ||
     (bVar5 = EBML_ElementIsFiniteSize((ebml_element *)Input_local), bVar5 == 0)) {
    peVar4 = ParserContext_local;
    if (ParserContext_local == (ebml_parser_context *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x123,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    pcVar1 = *(code **)&ParserContext_local->UpContext[3].Profile;
    fVar6 = EBML_ElementPositionData((ebml_element *)Input_local);
    lVar7 = (*pcVar1)(peVar4,fVar6,0);
    if (lVar7 == -1) {
      return -9;
    }
    DataPos = *(filepos_t *)(Input_local->URL + 0x18);
    Context.Context = (ebml_context *)AllowDummyElt_local;
    MaxSizeToRead = *(filepos_t *)(Input_local->URL + 0x38);
    Context.UpContext = (ebml_parser_context *)EBML_ElementPositionEnd((ebml_element *)Input_local);
    Context.EndPosition._0_4_ = *(undefined4 *)(AllowDummyElt_local + 0x18);
    CRCElement = (ebml_crc *)
                 EBML_FindNextElement
                           ((stream *)ParserContext_local,(ebml_parser_context *)&MaxSizeToRead,
                            (int *)((long)&bFirst + 4),bStack_38);
    while( true ) {
      bVar2 = false;
      if ((CRCElement != (ebml_crc *)0x0) && (bVar2 = false, bFirst._4_4_ < 1)) {
        bVar5 = EBML_ElementIsFiniteSize((ebml_element *)Input_local);
        bVar2 = true;
        if (bVar5 != 0) {
          fVar6 = EBML_ElementPositionEnd(&CRCElement->Base);
          fVar8 = EBML_ElementPositionEnd((ebml_element *)Input_local);
          bVar2 = fVar6 <= fVar8;
        }
      }
      if (!bVar2) break;
      if ((bStack_38 == 0) && (bVar5 = EBML_ElementIsDummy(&CRCElement->Base), bVar5 != 0)) {
        EBML_ElementSkipData
                  (&CRCElement->Base,(stream *)CrcBuffer._Used,(ebml_parser_context *)&MaxSizeToRead
                   ,(ebml_element *)0x0,bStack_38);
        NodeDelete((node *)CRCElement);
        CRCElement = (ebml_crc *)0x0;
      }
      else {
        if (CRCElement == (ebml_crc *)0x0) {
          __assert_fail("(const void*)(SubElement)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0x136,
                        "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                       );
        }
        if (sStack_48 == 0) {
          local_128 = 0;
        }
        else {
          local_128 = sStack_48 - 1;
        }
        lVar7 = (**(code **)((long)(CRCElement->Base).Base.Base.VMT + 0x78))
                          (CRCElement,CrcBuffer._Used,&MaxSizeToRead,bStack_38,
                           DepthCheckCRC_local._4_4_,local_128);
        if (lVar7 == 0) {
          if (((bVar3) && (sStack_48 != 0)) && (DepthCheckCRC_local._4_4_ != 2)) {
            Context_00 = EBML_getContextEbmlCrc32();
            bVar5 = EBML_ElementIsType(&CRCElement->Base,Context_00);
            if ((bVar5 != 0) && (ReadStream == (stream *)0x0)) {
              bVar5 = EBML_ElementIsFiniteSize((ebml_element *)Input_local);
              if (bVar5 != 0) {
                ReadStream = (stream *)CRCElement;
                bVar5 = Node_IsPartOf(ParserContext_local,0x534d454d);
                peVar4 = ParserContext_local;
                if (bVar5 == 0) {
                  local_10 = &CRCData;
                  CRCData = (uint8_t *)0x0;
                  CrcBuffer._Begin = (char *)0x0;
                  fVar6 = EBML_ElementPositionEnd((ebml_element *)Input_local);
                  fVar8 = EBML_ElementPositionEnd(&CRCElement->Base);
                  Offset = fVar6 - fVar8;
                  if ((Offset != 0xffffffffffffffff) &&
                     (bVar5 = ArrayResize((array *)&CRCData,Offset,0), bVar5 != 0)) {
                    CRCDataSize = (size_t)CRCData;
                    Context._24_8_ = CrcBuffer._Begin;
                    CrcBuffer._Used = (size_t)NodeCreate(Input_local,0x534d454d);
                    if ((node *)CrcBuffer._Used == (node *)0x0) {
                      CrcBuffer._Used = (size_t)ParserContext_local;
                      ArrayClear((array *)&CRCData);
                    }
                    else {
                      local_d8 = EBML_ElementPositionEnd(&CRCElement->Base);
                      if (CrcBuffer._Used == 0) {
                        __assert_fail("(const void*)(ReadStream)!=NULL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                      ,0x15e,
                                      "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                                     );
                      }
                      (**(code **)(*(long *)(CrcBuffer._Used + 8) + 0x20))
                                (CrcBuffer._Used,0x100,CRCDataSize,Context._24_8_);
                      if (CrcBuffer._Used == 0) {
                        __assert_fail("(const void*)(ReadStream)!=NULL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                      ,0x15f,
                                      "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                                     );
                      }
                      (**(code **)(*(long *)(CrcBuffer._Used + 8) + 0x20))
                                (CrcBuffer._Used,0x102,&local_d8,8);
                      peVar4 = ParserContext_local;
                      if (ParserContext_local == (ebml_parser_context *)0x0) {
                        __assert_fail("(const void*)(Input)!=NULL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                      ,0x160,
                                      "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                                     );
                      }
                      pcVar1 = *(code **)&ParserContext_local->UpContext[3].Profile;
                      fVar6 = EBML_ElementPositionEnd(&CRCElement->Base);
                      (*pcVar1)(peVar4,fVar6,0);
                      if (ParserContext_local == (ebml_parser_context *)0x0) {
                        __assert_fail("(const void*)(Input)!=NULL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                      ,0x161,
                                      "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                                     );
                      }
                      lVar7 = (**(code **)&ParserContext_local->UpContext[2].Profile)
                                        (ParserContext_local,CRCDataSize,Context._24_8_,0);
                      if (lVar7 != 0) {
                        StreamClose((stream *)CrcBuffer._Used);
                        CrcBuffer._Used = (size_t)ParserContext_local;
                        ArrayClear((array *)&CRCData);
                        CRCDataSize = 0;
                        ReadStream = (stream *)0x0;
                      }
                    }
                  }
                }
                else {
                  if (ParserContext_local == (ebml_parser_context *)0x0) {
                    __assert_fail("(const void*)(Input)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                  ,0x13f,
                                  "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                                 );
                  }
                  pcVar1 = *(code **)&ParserContext_local->UpContext[3].Profile;
                  fVar6 = EBML_ElementPositionEnd(&CRCElement->Base);
                  OffSet = (*pcVar1)(peVar4,fVar6,0);
                  if (ParserContext_local == (ebml_parser_context *)0x0) {
                    __assert_fail("(const void*)(Input)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                  ,0x141,
                                  "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                                 );
                  }
                  (**(code **)&ParserContext_local->UpContext->Profile)
                            (ParserContext_local,0x102,&element_size,8);
                  if (ParserContext_local == (ebml_parser_context *)0x0) {
                    __assert_fail("(const void*)(Input)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                  ,0x142,
                                  "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                                 );
                  }
                  (**(code **)&ParserContext_local->UpContext->Profile)
                            (ParserContext_local,0x101,&CRCDataSize,8);
                  CRCDataSize = (OffSet - element_size) + CRCDataSize;
                  fVar6 = EBML_ElementDataSize((ebml_element *)Input_local,1);
                  fVar8 = EBML_ElementFullSize(&CRCElement->Base,1);
                  Context._24_8_ = fVar6 - fVar8;
                  if (ParserContext_local == (ebml_parser_context *)0x0) {
                    __assert_fail("(const void*)(Input)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                                  ,0x145,
                                  "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                                 );
                  }
                  (**(code **)&ParserContext_local->UpContext[2].Profile)
                            (ParserContext_local,CRCDataSize,Context._24_8_,0);
                }
              }
              bVar3 = false;
            }
          }
          if (ReadStream != (stream *)CRCElement) {
            EBML_MasterAppend((ebml_master *)Input_local,&CRCElement->Base);
          }
          EBML_ElementSkipData
                    (&CRCElement->Base,(stream *)CrcBuffer._Used,
                     (ebml_parser_context *)&MaxSizeToRead,(ebml_element *)0x0,bStack_38);
        }
        else {
          NodeDelete((node *)CRCElement);
          CRCElement = (ebml_crc *)0x0;
        }
      }
      if (CRCElement != (ebml_crc *)0x0) {
        fVar6 = EBML_ElementPositionEnd((ebml_element *)Input_local);
        fVar8 = EBML_ElementPositionEnd(&CRCElement->Base);
        DataPos = fVar6 - fVar8;
      }
      if (bFirst._4_4_ < 1) {
        if (((bFirst._4_4_ < 0) && (bFirst._4_4_ = bFirst._4_4_ + 1, bFirst._4_4_ < 0)) ||
           ((bVar5 = EBML_ElementIsFiniteSize((ebml_element *)Input_local), bVar5 != 0 &&
            (DataPos < 1)))) break;
        CRCElement = (ebml_crc *)
                     EBML_FindNextElement
                               ((stream *)CrcBuffer._Used,(ebml_parser_context *)&MaxSizeToRead,
                                (int *)((long)&bFirst + 4),bStack_38);
      }
      else {
        bFirst._4_4_ = bFirst._4_4_ + -1;
        if ((0 < bFirst._4_4_) ||
           ((bVar5 = EBML_ElementIsFiniteSize((ebml_element *)Input_local), bVar5 != 0 &&
            (DataPos < 1)))) break;
      }
    }
  }
  if (CRCDataSize != 0) {
    bVar5 = EBML_CRCMatches((ebml_crc *)ReadStream,(void *)CRCDataSize,Context._24_8_);
    uVar9 = 1;
    if (bVar5 != 0) {
      uVar9 = 2;
    }
    *(undefined4 *)(Input_local->URL + 0x48) = uVar9;
    NodeDelete(&ReadStream->Base);
    if ((uint8_t *)CRCDataSize == CRCData) {
      StreamClose((stream *)CrcBuffer._Used);
      ArrayClear((array *)&CRCData);
    }
  }
  Input_local->URL[0x45] = '\x01';
  if (0 < bFirst._4_4_) {
    if (CRCElement == (ebml_crc *)0x0) {
      __assert_fail("SubElement!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a0,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    if (ParserContext_local == (ebml_parser_context *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a1,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    (**(code **)&ParserContext_local->UpContext[3].Profile)
              (ParserContext_local,(CRCElement->Base).ElementPosition,0);
    NodeDelete((node *)CRCElement);
  }
  return 0;
}

Assistant:

static err_t ReadData(ebml_string *Element, struct stream *Input, const ebml_parser_context *UNUSED_PARAM(ParserContext), bool_t UNUSED_PARAM(AllowDummyElt), int Scope, size_t UNUSED_PARAM(DepthCheckCRC))
{
    err_t Result;
    char *Buffer = NULL;

    Element->Base.bValueIsSet = 0;

    if (Scope == SCOPE_NO_DATA)
        return ERR_NONE;

    if (Stream_Seek(Input,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET)==INVALID_FILEPOS_T)
    {
        Result = ERR_READ;
        goto failed;
    }
#if MAX_FILEPOS >= SIZE_MAX
    if ((filepos_t)Element->Base.DataSize > (filepos_t)(SIZE_MAX - 1))
#else
    if ((size_t)Element->Base.DataSize > (size_t)(SIZE_MAX - 1))
#endif
    {
        Result = ERR_OUT_OF_MEMORY;
        goto failed;
    }

    Buffer = malloc((size_t)Element->Base.DataSize+1);
    if (!Buffer)
        return ERR_OUT_OF_MEMORY;

    Result = Stream_Read(Input,Buffer,(size_t)Element->Base.DataSize,NULL);
    if (Result != ERR_NONE)
        goto failed;

    Buffer[Element->Base.DataSize] = 0;
    Element->Buffer = Buffer;
    Element->Base.bValueIsSet = 1;
    return ERR_NONE;

failed:
    free(Buffer);
    Element->Buffer = NULL;
    return Result;
}